

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

void Curl_failf(Curl_easy *data,char *fmt,...)

{
  char in_AL;
  size_t size;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  char *pcVar1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_e8.reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e8.overflow_arg_area = &ap[0].overflow_arg_area;
  local_e8.gp_offset = 0x10;
  local_e8.fp_offset = 0x30;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  curl_mvsnprintf((data->state).buffer,0x4000,fmt,&local_e8);
  pcVar1 = (data->set).errorbuffer;
  if ((pcVar1 != (char *)0x0) && ((data->state).errorbuf == false)) {
    curl_msnprintf(pcVar1,0x100,"%s",(data->state).buffer);
    (data->state).errorbuf = true;
  }
  if ((data->set).verbose == true) {
    pcVar1 = (data->state).buffer;
    size = strlen(pcVar1);
    if (size < 0x3fff) {
      pcVar1[size] = '\n';
      (data->state).buffer[size + 1] = '\0';
      size = size + 1;
      pcVar1 = (data->state).buffer;
    }
    showit(data,CURLINFO_TEXT,pcVar1,size);
  }
  return;
}

Assistant:

void Curl_failf(struct Curl_easy *data, const char *fmt, ...)
{
  va_list ap;
  size_t len;
  va_start(ap, fmt);

  vsnprintf(data->state.buffer, BUFSIZE, fmt, ap);

  if(data->set.errorbuffer && !data->state.errorbuf) {
    snprintf(data->set.errorbuffer, CURL_ERROR_SIZE, "%s", data->state.buffer);
    data->state.errorbuf = TRUE; /* wrote error string */
  }
  if(data->set.verbose) {
    len = strlen(data->state.buffer);
    if(len < BUFSIZE - 1) {
      data->state.buffer[len] = '\n';
      data->state.buffer[++len] = '\0';
    }
    Curl_debug(data, CURLINFO_TEXT, data->state.buffer, len, NULL);
  }

  va_end(ap);
}